

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

int Shr_ObjPerformBidec(Shr_Man_t *p,Bdc_Man_t *pManDec,Gia_Man_t *pNew,Vec_Int_t *vLeafLits,
                       word uTruth1,word uTruthC)

{
  Vec_Int_t *pVVar1;
  Bdc_Man_t *pBVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Bdc_Fun_t *pBVar7;
  Gia_Obj_t *pObj_00;
  int nVars;
  int iLast;
  int nNodes;
  int iLit;
  int iVar;
  int i;
  Gia_Obj_t *pObj;
  Bdc_Fun_t *pFunc;
  word uTruthC_local;
  word uTruth1_local;
  Vec_Int_t *vLeafLits_local;
  Gia_Man_t *pNew_local;
  Bdc_Man_t *pManDec_local;
  Shr_Man_t *p_local;
  
  pFunc = (Bdc_Fun_t *)uTruthC;
  uTruthC_local = uTruth1;
  uTruth1_local = (word)vLeafLits;
  vLeafLits_local = (Vec_Int_t *)pNew;
  pNew_local = (Gia_Man_t *)pManDec;
  pManDec_local = (Bdc_Man_t *)p;
  iVar3 = Vec_IntSize(vLeafLits);
  if ((uTruthC_local != 0) && (pFunc != (Bdc_Fun_t *)0x0)) {
    Bdc_ManDecompose((Bdc_Man_t *)pNew_local,(uint *)&uTruthC_local,(uint *)&pFunc,iVar3,
                     (Vec_Ptr_t *)0x0,1000);
    pBVar7 = Bdc_ManFunc((Bdc_Man_t *)pNew_local,0);
    Bdc_FuncSetCopyInt(pBVar7,1);
    for (iLit = 0; iVar4 = Vec_IntSize((Vec_Int_t *)uTruth1_local), iLit < iVar4; iLit = iLit + 1) {
      iVar4 = Vec_IntEntry((Vec_Int_t *)uTruth1_local,iLit);
      pBVar7 = Bdc_ManFunc((Bdc_Man_t *)pNew_local,iLit + 1);
      iVar4 = Abc_Var2Lit(iVar4,0);
      Bdc_FuncSetCopyInt(pBVar7,iVar4);
    }
    iVar4 = Bdc_ManNodeNum((Bdc_Man_t *)pNew_local);
    iLit = iVar3;
    while( true ) {
      do {
        iLit = iLit + 1;
        if (iVar4 <= iLit) {
          pBVar7 = Bdc_ManRoot((Bdc_Man_t *)pNew_local);
          iVar3 = Bdc_FunObjCopy(pBVar7);
          return iVar3;
        }
        pBVar7 = Bdc_ManFunc((Bdc_Man_t *)pNew_local,iLit);
        iVar3 = Gia_ManObjNum((Gia_Man_t *)vLeafLits_local);
        pVVar1 = vLeafLits_local;
        iVar5 = Bdc_FunFanin0Copy(pBVar7);
        iVar6 = Bdc_FunFanin1Copy(pBVar7);
        iVar5 = Gia_ManHashAnd((Gia_Man_t *)pVVar1,iVar5,iVar6);
        Bdc_FuncSetCopyInt(pBVar7,iVar5);
        iVar6 = Gia_ManObjNum((Gia_Man_t *)vLeafLits_local);
      } while (iVar3 == iVar6);
      iVar6 = Gia_ManObjNum((Gia_Man_t *)vLeafLits_local);
      pVVar1 = vLeafLits_local;
      if (iVar3 + 1 != iVar6) break;
      iVar3 = Abc_Lit2Var(iVar5);
      pObj_00 = Gia_ManObj((Gia_Man_t *)pVVar1,iVar3);
      Gia_ObjSetAndLevel((Gia_Man_t *)vLeafLits_local,pObj_00);
      pBVar2 = pManDec_local;
      iVar3 = Gia_ObjFaninId0p((Gia_Man_t *)vLeafLits_local,pObj_00);
      iVar5 = Gia_ObjId((Gia_Man_t *)vLeafLits_local,pObj_00);
      Shr_ManAddFanout((Shr_Man_t *)pBVar2,iVar3,iVar5);
      pBVar2 = pManDec_local;
      iVar3 = Gia_ObjFaninId1p((Gia_Man_t *)vLeafLits_local,pObj_00);
      iVar5 = Gia_ObjId((Gia_Man_t *)vLeafLits_local,pObj_00);
      Shr_ManAddFanout((Shr_Man_t *)pBVar2,iVar3,iVar5);
      iVar3 = Gia_ManObjNum((Gia_Man_t *)vLeafLits_local);
      if (pManDec_local->nDivsLimit <= iVar3) {
        __assert_fail("Gia_ManObjNum(pNew) < p->nNewSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink6.c"
                      ,300,
                      "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
                     );
      }
    }
    __assert_fail("iLast + 1 == Gia_ManObjNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink6.c"
                  ,0x127,
                  "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
                 );
  }
  __assert_fail("uTruth1 != 0 && uTruthC != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink6.c"
                ,0x119,
                "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
               );
}

Assistant:

int Shr_ObjPerformBidec( Shr_Man_t * p, Bdc_Man_t * pManDec, Gia_Man_t * pNew, Vec_Int_t * vLeafLits, word uTruth1, word uTruthC )
{
    Bdc_Fun_t * pFunc;
    Gia_Obj_t * pObj;
    int i, iVar, iLit, nNodes, iLast;
    int nVars = Vec_IntSize(vLeafLits);
    assert( uTruth1 != 0 && uTruthC != 0 );
    Bdc_ManDecompose( pManDec, (unsigned *)&uTruth1, (unsigned *)&uTruthC, nVars, NULL, 1000 );
    Bdc_FuncSetCopyInt( Bdc_ManFunc(pManDec, 0), 1 );
    Vec_IntForEachEntry( vLeafLits, iVar, i )
        Bdc_FuncSetCopyInt( Bdc_ManFunc(pManDec, i+1), Abc_Var2Lit(iVar, 0) );
    nNodes = Bdc_ManNodeNum( pManDec );
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( pManDec, i );
        iLast = Gia_ManObjNum(pNew);
        iLit  = Gia_ManHashAnd( pNew, Bdc_FunFanin0Copy(pFunc), Bdc_FunFanin1Copy(pFunc) );
        Bdc_FuncSetCopyInt( pFunc, iLit );
        if ( iLast == Gia_ManObjNum(pNew) )
            continue;
        assert( iLast + 1 == Gia_ManObjNum(pNew) );
        pObj = Gia_ManObj(pNew, Abc_Lit2Var(iLit));
        Gia_ObjSetAndLevel( pNew, pObj );
        Shr_ManAddFanout( p, Gia_ObjFaninId0p(pNew, pObj), Gia_ObjId(pNew, pObj) );
        Shr_ManAddFanout( p, Gia_ObjFaninId1p(pNew, pObj), Gia_ObjId(pNew, pObj) );
        assert( Gia_ManObjNum(pNew) < p->nNewSize );
    }
    return Bdc_FunObjCopy( Bdc_ManRoot(pManDec) );
}